

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.h
# Opt level: O0

coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_>
std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_>::from_promise
          (LazyPromise<cinatra::part_head_t> *__promise)

{
  long in_RDI;
  coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_> __tmp;
  coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_> local_8;
  
  coroutine_handle(&local_8);
  return (coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_>)
         (void *)(in_RDI + -0x10);
}

Assistant:

static coroutine_handle from_promise(_Promise& __promise) {
        using _RawPromise = typename remove_cv<_Promise>::type;
        coroutine_handle __tmp;
        __tmp.__handle_ = __builtin_coro_promise(
            std::addressof(const_cast<_RawPromise&>(__promise)),
            alignof(_Promise), true);
        return __tmp;
    }